

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

Token * __thiscall Lexer::match_name(Token *__return_storage_ptr__,Lexer *this)

{
  char *c;
  bool bVar1;
  ostream *poVar2;
  lexer_exception *this_00;
  Type local_1fc;
  string local_1f8;
  string res;
  stringstream buffer;
  ostream local_1a8 [8];
  string local_1a0 [368];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&buffer);
  c = &this->current_;
  do {
    do {
      std::operator<<(local_1a8,*c);
      res._M_dataplus._M_p._0_1_ = 0;
      consume(this,(bool *)&res);
      bVar1 = Recognition::is_letter(c);
    } while (bVar1);
  } while ((byte)(*c - 0x30U) < 10);
  std::__cxx11::stringbuf::str();
  bVar1 = std::operator==(&res,anon_var_dwarf_8b0ae + 0x17);
  if (bVar1) {
    local_1fc = kRead;
    local_1f8._M_string_length._0_4_ = (this->position_).super_Position.row_;
    local_1f8._M_string_length._4_4_ = (this->position_).super_Position.col_;
    local_1f8._M_dataplus._M_p = (pointer)&PTR_clear_001599f0;
    local_1f8.field_2._M_allocated_capacity._0_4_ = (undefined4)res._M_string_length;
    Token::Token(__return_storage_ptr__,&local_1fc,(TokenPosition *)&local_1f8);
  }
  else {
    bVar1 = std::operator==(&res,"write");
    if (bVar1) {
      local_1fc = kWrite;
      local_1f8._M_string_length._0_4_ = (this->position_).super_Position.row_;
      local_1f8._M_string_length._4_4_ = (this->position_).super_Position.col_;
      local_1f8._M_dataplus._M_p = (pointer)&PTR_clear_001599f0;
      local_1f8.field_2._M_allocated_capacity._0_4_ = (undefined4)res._M_string_length;
      Token::Token(__return_storage_ptr__,&local_1fc,(TokenPosition *)&local_1f8);
    }
    else {
      bVar1 = std::operator==(&res,"while");
      if (bVar1) {
        local_1fc = kWhile;
        local_1f8._M_string_length._0_4_ = (this->position_).super_Position.row_;
        local_1f8._M_string_length._4_4_ = (this->position_).super_Position.col_;
        local_1f8._M_dataplus._M_p = (pointer)&PTR_clear_001599f0;
        local_1f8.field_2._M_allocated_capacity._0_4_ = (undefined4)res._M_string_length;
        Token::Token(__return_storage_ptr__,&local_1fc,(TokenPosition *)&local_1f8);
      }
      else {
        bVar1 = std::operator==(&res,"if");
        if (bVar1) {
          local_1fc = kIf;
          local_1f8._M_string_length._0_4_ = (this->position_).super_Position.row_;
          local_1f8._M_string_length._4_4_ = (this->position_).super_Position.col_;
          local_1f8._M_dataplus._M_p = (pointer)&PTR_clear_001599f0;
          local_1f8.field_2._M_allocated_capacity._0_4_ = (undefined4)res._M_string_length;
          Token::Token(__return_storage_ptr__,&local_1fc,(TokenPosition *)&local_1f8);
        }
        else {
          bVar1 = std::operator==(&res,"else");
          if (bVar1) {
            local_1fc = kElse;
            local_1f8._M_string_length._0_4_ = (this->position_).super_Position.row_;
            local_1f8._M_string_length._4_4_ = (this->position_).super_Position.col_;
            local_1f8._M_dataplus._M_p = (pointer)&PTR_clear_001599f0;
            local_1f8.field_2._M_allocated_capacity._0_4_ = (undefined4)res._M_string_length;
            Token::Token(__return_storage_ptr__,&local_1fc,(TokenPosition *)&local_1f8);
          }
          else {
            bVar1 = std::operator==(&res,"int");
            if (bVar1) {
              local_1fc = kInt;
              local_1f8._M_string_length._0_4_ = (this->position_).super_Position.row_;
              local_1f8._M_string_length._4_4_ = (this->position_).super_Position.col_;
              local_1f8._M_dataplus._M_p = (pointer)&PTR_clear_001599f0;
              local_1f8.field_2._M_allocated_capacity._0_4_ = (undefined4)res._M_string_length;
              Token::Token(__return_storage_ptr__,&local_1fc,(TokenPosition *)&local_1f8);
            }
            else {
              bVar1 = std::operator==(&res,"real");
              if (bVar1) {
                local_1fc = kReal;
                local_1f8._M_string_length._0_4_ = (this->position_).super_Position.row_;
                local_1f8._M_string_length._4_4_ = (this->position_).super_Position.col_;
                local_1f8._M_dataplus._M_p = (pointer)&PTR_clear_001599f0;
                local_1f8.field_2._M_allocated_capacity._0_4_ = (undefined4)res._M_string_length;
                Token::Token(__return_storage_ptr__,&local_1fc,(TokenPosition *)&local_1f8);
              }
              else {
                bVar1 = std::operator==(&res,anon_var_dwarf_77c10 + 0x29);
                if (bVar1) {
                  local_1fc = kVoid;
                  local_1f8._M_string_length._0_4_ = (this->position_).super_Position.row_;
                  local_1f8._M_string_length._4_4_ = (this->position_).super_Position.col_;
                  local_1f8._M_dataplus._M_p = (pointer)&PTR_clear_001599f0;
                  local_1f8.field_2._M_allocated_capacity._0_4_ = (undefined4)res._M_string_length;
                  Token::Token(__return_storage_ptr__,&local_1fc,(TokenPosition *)&local_1f8);
                }
                else {
                  bVar1 = std::operator==(&res,"func");
                  if (bVar1) {
                    local_1fc = kFunc;
                    local_1f8._M_string_length._0_4_ = (this->position_).super_Position.row_;
                    local_1f8._M_string_length._4_4_ = (this->position_).super_Position.col_;
                    local_1f8._M_dataplus._M_p = (pointer)&PTR_clear_001599f0;
                    local_1f8.field_2._M_allocated_capacity._0_4_ = (undefined4)res._M_string_length
                    ;
                    Token::Token(__return_storage_ptr__,&local_1fc,(TokenPosition *)&local_1f8);
                  }
                  else {
                    bVar1 = std::operator==(&res,"return");
                    if (bVar1) {
                      local_1fc = kReturn;
                      local_1f8._M_string_length._0_4_ = (this->position_).super_Position.row_;
                      local_1f8._M_string_length._4_4_ = (this->position_).super_Position.col_;
                      local_1f8._M_dataplus._M_p = (pointer)&PTR_clear_001599f0;
                      local_1f8.field_2._M_allocated_capacity._0_4_ =
                           (undefined4)res._M_string_length;
                      Token::Token(__return_storage_ptr__,&local_1fc,(TokenPosition *)&local_1f8);
                    }
                    else {
                      bVar1 = Recognition::is_id(&res);
                      if (!bVar1) {
                        std::__cxx11::string::string
                                  ((string *)&local_1f8,"",(allocator *)&local_1fc);
                        std::__cxx11::stringbuf::str(local_1a0);
                        std::__cxx11::string::~string((string *)&local_1f8);
                        poVar2 = std::operator<<(local_1a8,anon_var_dwarf_3abc5);
                        poVar2 = std::operator<<(poVar2,(string *)&res);
                        std::operator<<(poVar2,"\"");
                        this_00 = (lexer_exception *)__cxa_allocate_exception(0x38);
                        std::__cxx11::stringbuf::str();
                        lexer_exception::lexer_exception(this_00,&this->position_,&local_1f8);
                        __cxa_throw(this_00,&lexer_exception::typeinfo,
                                    lexer_exception::~lexer_exception);
                      }
                      local_1fc = kIdentity;
                      local_1f8._M_string_length._0_4_ = (this->position_).super_Position.row_;
                      local_1f8._M_string_length._4_4_ = (this->position_).super_Position.col_;
                      local_1f8._M_dataplus._M_p = (pointer)&PTR_clear_001599f0;
                      local_1f8.field_2._M_allocated_capacity._0_4_ =
                           (undefined4)res._M_string_length;
                      Token::Token(__return_storage_ptr__,&local_1fc,&res,
                                   (TokenPosition *)&local_1f8);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&res);
  std::__cxx11::stringstream::~stringstream((stringstream *)&buffer);
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::match_name() {
    std::stringstream buffer;
    do {
        buffer << current_;
        consume(false);
    } while (Recognition::is_letter(current_) || Recognition::is_digit(current_));

    std::string res = buffer.str();
    int length = (int)res.length();
    if (res == "read") {
        return Token(Token::Type::kRead, TokenPosition(position_, length));
    } else if (res == "write") {
        return Token(Token::Type::kWrite, TokenPosition(position_, length));
    } else if (res == "while") {
        return Token(Token::Type::kWhile, TokenPosition(position_, length));
    } else if (res == "if") {
        return Token(Token::Type::kIf, TokenPosition(position_, length));
    } else if (res == "else") {
        return Token(Token::Type::kElse, TokenPosition(position_, length));
    } else if (res == "int") {
        return Token(Token::Type::kInt, TokenPosition(position_, length));
    } else if (res == "real") {
        return Token(Token::Type::kReal, TokenPosition(position_, length));
    } else if (res == "void") {
        return Token(Token::Type::kVoid, TokenPosition(position_, length));
    } else if (res == "func") {
        return Token(Token::Type::kFunc, TokenPosition(position_, length));
    } else if (res == "return") {
        return Token(Token::Type::kReturn, TokenPosition(position_, length));
    } else if (Recognition::is_id(res)) {
        return Token(Token::Type::kIdentity, res, TokenPosition(position_, length));
    } else {
        buffer.str("");
        buffer << "不正确的标识符: \"" << res << "\"";
        throw lexer_exception(position_, buffer.str());
    }
}